

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_typedef(lysp_yang_ctx *ctx,lysp_node *parent,lysp_tpdf **typedefs)

{
  LY_ERR LVar1;
  lysp_tpdf *str_p;
  char *pcVar2;
  ly_ctx *local_e8;
  ly_ctx *local_d8;
  ly_ctx *local_c0;
  char *local_b8;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_60;
  LY_ERR ret__;
  char *p__;
  lysp_tpdf *tpdf;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_tpdf **pplStack_28;
  LY_ERR ret;
  lysp_tpdf **typedefs_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = typedefs;
  typedefs_local = (lysp_tpdf **)parent;
  parent_local = (lysp_node *)ctx;
  if (*typedefs == (lysp_tpdf *)0x0) {
    puStack_60 = (undefined8 *)malloc(0xb8);
    if (puStack_60 == (undefined8 *)0x0) {
      if (parent_local == (lysp_node *)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = *(ly_ctx **)
                    **(undefined8 **)
                      (parent_local->exts->argument +
                      (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
      }
      ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_typedef");
      return LY_EMEM;
    }
    *puStack_60 = 1;
  }
  else {
    *(long *)&(*typedefs)[-1].flags = *(long *)&(*typedefs)[-1].flags + 1;
    puStack_60 = (undefined8 *)
                 realloc(&(*typedefs)[-1].flags,*(long *)&(*typedefs)[-1].flags * 0xb0 + 8);
    if (puStack_60 == (undefined8 *)0x0) {
      *(long *)&(*pplStack_28)[-1].flags = *(long *)&(*pplStack_28)[-1].flags + -1;
      if (parent_local == (lysp_node *)0x0) {
        local_90 = (ly_ctx *)0x0;
      }
      else {
        local_90 = *(ly_ctx **)
                    **(undefined8 **)
                      (parent_local->exts->argument +
                      (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
      }
      ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_typedef");
      return LY_EMEM;
    }
  }
  *pplStack_28 = (lysp_tpdf *)(puStack_60 + 1);
  str_p = *pplStack_28 + *(long *)&(*pplStack_28)[-1].flags + -1;
  memset(str_p,0,0xb0);
  LVar1 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_a8 = (ly_ctx *)0x0;
    }
    else {
      local_a8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_b8 = "";
    }
    else {
      local_b8 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_a8,local_b8,sStack_48,&str_p->name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_a0 = (ly_ctx *)0x0;
    }
    else {
      local_a0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_a0,(char *)word_len,&str_p->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&tpdf + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (tpdf._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (tpdf._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_c0 = (ly_ctx *)0x0;
          }
          else {
            local_c0 = *(ly_ctx **)
                        **(undefined8 **)
                          (parent_local->exts->argument +
                          (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar2 = lyplg_ext_stmt2str(tpdf._4_4_);
          ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&tpdf + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = tpdf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (tpdf._4_4_ == LY_STMT_DEFAULT) {
          LVar1 = parse_text_field((lysp_yang_ctx *)parent_local,&str_p->dflt,LY_STMT_DEFAULT,0,
                                   &(str_p->dflt).str,Y_STR_ARG,&(str_p->dflt).flags,&str_p->exts);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          (str_p->dflt).mod =
               *(lysp_module **)
                (parent_local->exts->argument +
                (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        else {
          if (tpdf._4_4_ == LY_STMT_DESCRIPTION) {
            LVar1 = parse_text_field((lysp_yang_ctx *)parent_local,str_p->dsc,LY_STMT_DESCRIPTION,0,
                                     &str_p->dsc,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
          }
          else {
            if (tpdf._4_4_ != LY_STMT_EXTENSION_INSTANCE) {
              if (tpdf._4_4_ == LY_STMT_REFERENCE) {
                LVar1 = parse_text_field((lysp_yang_ctx *)parent_local,str_p->ref,LY_STMT_REFERENCE,
                                         0,&str_p->ref,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
              }
              else if (tpdf._4_4_ == LY_STMT_STATUS) {
                LVar1 = parse_status((lysp_yang_ctx *)parent_local,&str_p->flags,&str_p->exts);
              }
              else if (tpdf._4_4_ == LY_STMT_TYPE) {
                LVar1 = parse_type((lysp_yang_ctx *)parent_local,&str_p->type);
              }
              else {
                if (tpdf._4_4_ != LY_STMT_UNITS) {
                  if (parent_local == (lysp_node *)0x0) {
                    local_d8 = (ly_ctx *)0x0;
                  }
                  else {
                    local_d8 = *(ly_ctx **)
                                **(undefined8 **)
                                  (parent_local->exts->argument +
                                  (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
                  }
                  pcVar2 = lyplg_ext_stmt2str(tpdf._4_4_);
                  ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"typedef");
                  return LY_EVALID;
                }
                LVar1 = parse_text_field((lysp_yang_ctx *)parent_local,str_p->units,LY_STMT_UNITS,0,
                                         &str_p->units,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
              }
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
              goto LAB_001c37db;
            }
            LVar1 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,str_p,
                              LY_STMT_TYPEDEF,0,&str_p->exts);
          }
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
        }
LAB_001c37db:
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&tpdf + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (tpdf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((str_p->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,str_p->exts,'\x01',
                                 (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
      if ((str_p->type).name == (char *)0x0) {
        if (parent_local == (lysp_node *)0x0) {
          local_e8 = (ly_ctx *)0x0;
        }
        else {
          local_e8 = *(ly_ctx **)
                      **(undefined8 **)
                        (parent_local->exts->argument +
                        (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Missing mandatory keyword \"%s\" as a child of \"%s\".","type","typedef");
        return LY_EVALID;
      }
      if (typedefs_local != (lysp_tpdf **)0x0) {
        if (parent_local[1].parent == (lysp_node *)0x0) {
          __assert_fail("ctx->main_ctx",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                        ,0xb14,
                        "LY_ERR parse_typedef(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_tpdf **)"
                       );
        }
        LVar1 = ly_set_add((ly_set *)&(parent_local[1].parent)->nodetype,typedefs_local,'\0',
                           (uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_typedef(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_tpdf **typedefs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_tpdf *tpdf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *typedefs, tpdf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, tpdf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &tpdf->dflt, LY_STMT_DEFAULT, 0, &tpdf->dflt.str, Y_STR_ARG,
                    &tpdf->dflt.flags, &tpdf->exts));
            tpdf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->dsc, LY_STMT_DESCRIPTION, 0, &tpdf->dsc, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->ref, LY_STMT_REFERENCE, 0, &tpdf->ref, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &tpdf->flags, &tpdf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &tpdf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->units, LY_STMT_UNITS, 0, &tpdf->units, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, tpdf, LY_STMT_TYPEDEF, 0, &tpdf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "typedef");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, tpdf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!tpdf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "typedef");
        return LY_EVALID;
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->tpdfs_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}